

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O1

_Bool bson_validate(bson_t *bson,bson_validate_flags_t flags,size_t *offset)

{
  bson_validate_state_t state;
  bson_validate_state_t local_228;
  
  local_228.flags = flags;
  _bson_validate_internal(bson,&local_228);
  if (offset != (size_t *)0x0 && 0 < local_228.err_offset) {
    *offset = local_228.err_offset;
  }
  return SUB81((ulong)local_228.err_offset >> 0x3f,0);
}

Assistant:

bool
bson_validate (const bson_t *bson, bson_validate_flags_t flags, size_t *offset)
{
   bson_validate_state_t state;

   state.flags = flags;
   _bson_validate_internal (bson, &state);

   if (state.err_offset > 0 && offset) {
      *offset = (size_t) state.err_offset;
   }

   return state.err_offset < 0;
}